

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nifticdf.c
# Opt level: O0

double fpser(double *a,double *b,double *x,double *eps)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double *eps_local;
  double *x_local;
  double *b_local;
  double *a_local;
  
  fpser::fpser = 1.0;
  if (*eps * 0.001 < *a) {
    fpser::fpser = 0.0;
    dVar1 = *a;
    dVar2 = log(*x);
    fpser::t = dVar1 * dVar2;
    dVar3 = exparg(&fpser::K1);
    if (dVar1 * dVar2 < dVar3) {
      return fpser::fpser;
    }
    fpser::fpser = exp(fpser::t);
  }
  fpser::an = *a + 1.0;
  fpser::t = *x;
  fpser::s = fpser::t / fpser::an;
  do {
    fpser::an = fpser::an + 1.0;
    fpser::t = *x * fpser::t;
    fpser::c = fpser::t / fpser::an;
    fpser::s = fpser::c + fpser::s;
  } while (*eps / *a < ABS(fpser::c));
  fpser::fpser = (*a * fpser::s + 1.0) * (*b / *a) * fpser::fpser;
  fpser::tol = *eps / *a;
  return fpser::fpser;
}

Assistant:

double fpser(double *a,double *b,double *x,double *eps)
/*
-----------------------------------------------------------------------

                 EVALUATION OF I (A,B)
                                X

          FOR B .LT. MIN(EPS,EPS*A) AND X .LE. 0.5.

-----------------------------------------------------------------------

                  SET  FPSER = X**A
*/
{
static int K1 = 1;
static double fpser,an,c,s,t,tol;
/*
     ..
     .. Executable Statements ..
*/
    fpser = 1.0e0;
    if(*a <= 1.e-3**eps) goto S10;
    fpser = 0.0e0;
    t = *a*log(*x);
    if(t < exparg(&K1)) return fpser;
    fpser = exp(t);
S10:
/*
                NOTE THAT 1/B(A,B) = B
*/
    fpser = *b/ *a*fpser;
    tol = *eps/ *a;
    an = *a+1.0e0;
    t = *x;
    s = t/an;
S20:
    an += 1.0e0;
    t = *x*t;
    c = t/an;
    s += c;
    if(fabs(c) > tol) goto S20;
    fpser *= (1.0e0+*a*s);
    return fpser;
}